

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O3

void __thiscall binpac::FlowBuffer::GrowFrame(FlowBuffer *this,int length)

{
  if (this->frame_length_ < length) {
    this->mode_ = FRAME_MODE;
    this->frame_length_ = length;
    MarkOrCopyFrame(this);
    return;
  }
  return;
}

Assistant:

void FlowBuffer::GrowFrame(int length)
	{
	BINPAC_ASSERT(frame_length_ >= 0);
	if ( length <= frame_length_ )
		return;
	BINPAC_ASSERT(! chunked_ || frame_length_ == 0);
	mode_ = FRAME_MODE;
	frame_length_ = length;
	MarkOrCopyFrame();
	}